

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_data.cpp
# Opt level: O1

void duckdb::ArrowStructData::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowAppendData *in_RAX;
  child_list_t<LogicalType> *this;
  long lVar1;
  const_reference pvVar2;
  reference pvVar3;
  ArrowArray *pAVar4;
  reference pvVar5;
  size_type __n;
  byte bVar6;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_38;
  
  bVar6 = 0;
  result->n_buffers = 1;
  local_38._M_head_impl = in_RAX;
  this = StructType::GetChildTypes_abi_cxx11_(type);
  ArrowAppender::AddChildren
            (append_data,
             ((long)(this->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  result->children =
       (append_data->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar1 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                    (((long)(this->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  result->n_children = lVar1;
  if ((this->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar2 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this,__n);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
               ::operator[](&append_data->child_data,__n);
      local_38._M_head_impl =
           (pvVar3->
           super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
           .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
      (pvVar3->
      super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)._M_t
      .super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
      .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0
      ;
      pAVar4 = ArrowAppender::FinalizeChild
                         (&pvVar2->second,
                          (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                           *)&local_38);
      pvVar5 = vector<ArrowArray,_true>::operator[](&append_data->child_arrays,__n);
      for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
        pvVar5->length = pAVar4->length;
        pAVar4 = (ArrowArray *)((long)pAVar4 + (ulong)bVar6 * -0x10 + 8);
        pvVar5 = (reference)((long)pvVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
      ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
                   *)&local_38);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void ArrowStructData::Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
	result->n_buffers = 1;

	auto &child_types = StructType::GetChildTypes(type);
	ArrowAppender::AddChildren(append_data, child_types.size());
	result->children = append_data.child_pointers.data();
	result->n_children = NumericCast<int64_t>(child_types.size());
	for (idx_t i = 0; i < child_types.size(); i++) {
		auto &child_type = child_types[i].second;
		append_data.child_arrays[i] = *ArrowAppender::FinalizeChild(child_type, std::move(append_data.child_data[i]));
	}
}